

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_SupportSize(DdManager *dd,DdNode *f)

{
  int *support;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar3 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar3 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    iVar2 = -1;
  }
  else {
    uVar1 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar1;
    }
    for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      support[uVar1] = 0;
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    iVar2 = 0;
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      iVar2 = iVar2 + (uint)(support[uVar1] == 1);
    }
    free(support);
  }
  return iVar2;
}

Assistant:

int
Cudd_SupportSize(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support size is sought */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    /* Count support variables. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}